

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double * fisher_sample(double kappa,double *mu,int n,int *seed)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int i;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  double local_d8;
  double a [9];
  double local_88;
  double rst [3];
  
  dVar1 = 0.0;
  lVar5 = 0;
  do {
    dVar1 = dVar1 + mu[lVar5] * mu[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"FISHER_SAMPLE - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  MU = 0.\n");
    exit(1);
  }
  dVar1 = acos(mu[2] / dVar1);
  dVar1 = -dVar1;
  dVar2 = atan2(mu[1],*mu);
  dVar3 = exp(kappa * -2.0);
  pdVar6 = r8vec_uniform_01_new(n,seed);
  uVar13 = (ulong)(uint)n;
  if (n < 1) {
    pdVar7 = r8vec_uniform_01_new(n,seed);
  }
  else {
    rst[2] = 1.0 - dVar3;
    uVar12 = 0;
    do {
      if ((kappa != 0.0) || (NAN(kappa))) {
        dVar4 = log(pdVar6[uVar12] * rst[2] + dVar3);
        dVar4 = -dVar4 / (kappa + kappa);
      }
      else {
        dVar4 = 1.0 - pdVar6[uVar12];
      }
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      dVar4 = asin(dVar4);
      pdVar6[uVar12] = dVar4 + dVar4;
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
    pdVar7 = r8vec_uniform_01_new(n,seed);
    if (0 < n) {
      uVar12 = 0;
      do {
        pdVar7[uVar12] = pdVar7[uVar12] * 6.283185307179586;
        uVar12 = uVar12 + 1;
      } while (uVar13 != uVar12);
    }
  }
  dVar3 = cos(dVar1);
  local_d8 = cos(dVar2);
  local_d8 = local_d8 * dVar3;
  dVar3 = sin(dVar2);
  a[0] = -dVar3;
  dVar3 = sin(dVar1);
  dVar4 = cos(dVar2);
  a[1] = dVar4 * dVar3;
  dVar3 = cos(dVar1);
  dVar4 = sin(dVar2);
  a[2] = dVar4 * dVar3;
  a[3] = cos(dVar2);
  dVar3 = sin(dVar1);
  dVar2 = sin(dVar2);
  a[4] = dVar2 * dVar3;
  dVar2 = sin(dVar1);
  a[5] = -dVar2;
  a[6] = 0.0;
  a[7] = cos(dVar1);
  uVar12 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar12 = (long)(n * 3) << 3;
  }
  pdVar8 = (double *)operator_new__(uVar12);
  if (0 < n) {
    uVar12 = 0;
    do {
      sin(pdVar6[uVar12]);
      cos(pdVar7[uVar12]);
      dVar1 = sin(pdVar6[uVar12]);
      dVar2 = sin(pdVar7[uVar12]);
      rst[0] = dVar2 * dVar1;
      rst[1] = cos(pdVar6[uVar12]);
      pdVar9 = &local_d8;
      lVar5 = 0;
      do {
        dVar1 = 0.0;
        lVar11 = 0;
        pdVar10 = pdVar9;
        do {
          dVar1 = dVar1 + *pdVar10 * rst[lVar11 + -1];
          lVar11 = lVar11 + 1;
          pdVar10 = pdVar10 + 3;
        } while (lVar11 != 3);
        pdVar8[uVar12 * 3 + lVar5] = dVar1;
        lVar5 = lVar5 + 1;
        pdVar9 = pdVar9 + 1;
      } while (lVar5 != 3);
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar13);
  }
  if (pdVar6 != (double *)0x0) {
    operator_delete__(pdVar6);
  }
  if (pdVar7 != (double *)0x0) {
    operator_delete__(pdVar7);
  }
  return pdVar8;
}

Assistant:

double *fisher_sample ( double kappa, double mu[], int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    FISHER_SAMPLE samples the Fisher distribution.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    06 March 2007
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Nicholas Fisher, Toby Lewis, Brian Embleton,
//    Statistical Analysis of Spherical Data,
//    Cambridge, 2003,
//    ISBN13: 978-0521456999,
//    LC: QA276.F489.
//
//  Parameters:
//
//    Input, double KAPPA, the concentration parameter.
//
//    Input, double MU[3], the mean direction.
//    MU should have unit Euclidean norm, but this routine will
//    automatically work with a normalized version of MU.
//
//    Input, int N, the number of samples to choose.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double FISHER_SAMPLE[3*N], a sample of the Fisher distribution.
//
//  Local Parameters:
//
//    Local, double ALPHA, BETA, the colatitude (theta) and
//    longitude (phi) of the mean direction.
//
{
  double a[3*3];
  double alpha;
  double beta;
  int i;
  int j;
  int k;
  double lambda;
  double mu_norm;
  double *phi;
  const double r8_pi = 3.141592653589793;
  double rst[3];
  double *theta;
  double *xyz;

  mu_norm = r8vec_length ( 3, mu );

  if ( mu_norm == 0.0 )
  {
    cerr << "\n";
    cerr << "FISHER_SAMPLE - Fatal error!\n";
    cerr << "  MU = 0.\n";
    exit ( 1 );
  }

  alpha = - acos ( mu[2] / mu_norm );
  beta = atan2 ( mu[1], mu[0] );

  lambda = exp ( - 2.0 * kappa );

  theta = r8vec_uniform_01_new ( n, seed );

  for ( k = 0; k < n; k++ )
  {
    if ( kappa == 0.0 )
    {
      theta[k] = 2.0 * asin ( sqrt ( 1.0 - theta[k] ) );
    }
    else
    {
      theta[k] = 2.0 * asin ( sqrt (
        - log ( theta[k] * ( 1.0 - lambda ) + lambda )
        / ( 2.0 * kappa ) ) );
    }
  }

  phi = r8vec_uniform_01_new ( n, seed );

  for ( k = 0; k < n; k++ )
  {
    phi[k] = 2.0 * r8_pi * phi[k];
  }
//
//  Compute the rotation matrix.
//
  a[0+0*3] =   cos ( alpha ) * cos ( beta );
  a[1+0*3] =                 - sin ( beta );
  a[2+0*3] =   sin ( alpha ) * cos ( beta );

  a[0+1*3] =   cos ( alpha ) * sin ( beta );
  a[1+1*3] =                 + cos ( beta );
  a[2+1*3] =   sin ( alpha ) * sin ( beta );

  a[0+2*3] = - sin ( alpha );
  a[1+2*3] =   0.0;
  a[2+2*3] =   cos ( alpha );
//
//  Compute the unrotated points.
//
  xyz = new double[3*n];

  for ( k = 0; k < n; k++ )
  {
    rst[0] = sin ( theta[k] ) * cos ( phi[k] );
    rst[1] = sin ( theta[k] ) * sin ( phi[k] );
    rst[2] = cos ( theta[k] );
//
//  Rotate the points.
//
    for ( i = 0; i < 3; i++ )
    {
      xyz[i+k*3] = 0.0;
      for ( j = 0; j < 3; j++ )
      {
        xyz[i+k*3] = xyz[i+k*3] + a[i+j*3] * rst[j];
      }
    }
  }

  delete [] theta;
  delete [] phi;

  return xyz;
}